

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::MakeDefaultFieldName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,FieldDescriptor *field)

{
  AlphaNum *in_RCX;
  FieldDescriptor *field_00;
  string local_98;
  AlphaNum local_78;
  AlphaNum local_48;
  cpp *local_18;
  FieldDescriptor *field_local;
  
  local_18 = this;
  field_local = (FieldDescriptor *)__return_storage_ptr__;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_48,"Impl_::");
  MakeDefaultName_abi_cxx11_(&local_98,local_18,field_00);
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_78,&local_98);
  absl::lts_20250127::StrCat_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)&local_48,&local_78,in_RCX);
  std::__cxx11::string::~string((string *)&local_98);
  return __return_storage_ptr__;
}

Assistant:

inline std::string MakeDefaultFieldName(const FieldDescriptor* field) {
  return absl::StrCat("Impl_::", MakeDefaultName(field));
}